

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFilteringTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::TextureCubeArrayFilteringCase::iterate
          (TextureCubeArrayFilteringCase *this)

{
  code *pcVar1;
  TestContext *pTVar2;
  int y;
  int iVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  uint uVar6;
  qpTestResult qVar7;
  TestLog *this_00;
  RenderContext *context;
  undefined4 extraout_var;
  char *str;
  CommandLine *this_01;
  RenderTarget *renderTarget;
  reference pvVar9;
  TextureCubeArray *pTVar10;
  TextureFormat *pTVar11;
  TestLog *pTVar12;
  NotSupportedError *this_02;
  MessageBuilder *pMVar13;
  reference pvVar14;
  undefined4 extraout_var_00;
  PixelFormat *pPVar15;
  size_type sVar16;
  TextureCubeArrayView TVar17;
  bool local_c65;
  MessageBuilder local_ba8;
  TextureCubeArrayView local_a28;
  ConstPixelBufferAccess local_a18;
  undefined1 local_9e9;
  undefined1 local_9e8 [7];
  bool isOk;
  Vector<int,_3> local_864;
  TextureCubeArrayView local_858;
  ConstPixelBufferAccess local_848;
  undefined1 local_81d;
  float local_81c;
  undefined1 auStack_818 [3];
  bool isHighQuality;
  int iStack_814;
  int local_810;
  undefined1 local_80c [12];
  Vector<float,_4> local_800;
  tcu local_7f0 [8];
  float afStack_7e8 [2];
  undefined1 local_7e0 [8];
  LookupPrecision lookupPrecision;
  LodPrecision lodPrecision;
  Vector<int,_4> local_798;
  Vector<int,_4> local_788;
  undefined1 local_778 [8];
  IVec4 colorBits;
  IVec4 coordBits;
  PixelFormat pixelFormat;
  undefined1 local_738 [7];
  bool isNearestOnly;
  MessageBuilder local_710;
  char *local_590;
  MessageBuilder local_588;
  undefined1 local_408 [8];
  vector<float,_std::allocator<float>_> texCoord;
  Surface result;
  CubeFace face;
  int faceNdx;
  float local_250 [2];
  Sampler local_248;
  undefined1 local_20c [8];
  ReferenceParams refParams;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  ScopedLogSection local_98;
  ScopedLogSection section;
  TextureFormatInfo fmtInfo;
  TextureFormat texFmt;
  FilterCase *curCase;
  RandomViewport viewport;
  deUint32 randomSeed;
  int viewportSize;
  Functions *gl;
  RenderContext *renderCtx;
  TestLog *log;
  TextureCubeArrayFilteringCase *this_local;
  long lVar8;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  context = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*context->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  viewport.height = 0x1c;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(str);
  dVar5 = deInt32Hash(this->m_caseNdx);
  this_01 = tcu::TestContext::getCommandLine
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  uVar6 = tcu::CommandLine::getBaseSeed(this_01);
  viewport.width = dVar4 ^ dVar5 ^ uVar6;
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&curCase,renderTarget,0x1c,0x1c,viewport.width);
  pvVar9 = std::
           vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
           ::operator[](&this->m_cases,(long)this->m_caseNdx);
  pTVar10 = glu::TextureCubeArray::getRefTexture(pvVar9->texture);
  pTVar11 = tcu::TextureLevelPyramid::getFormat(&pTVar10->super_TextureLevelPyramid);
  fmtInfo.lookupBias.m_data._8_8_ = *pTVar11;
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&section,(TextureFormat *)(fmtInfo.lookupBias.m_data + 2));
  pTVar12 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Test",&local_d9);
  de::toString<int>(&local_110,&this->m_caseNdx);
  std::operator+(&local_b8,&local_d8,&local_110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"Test ",&local_151);
  de::toString<int>((string *)&refParams.baseLevel,&this->m_caseNdx);
  std::operator+(&local_130,&local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &refParams.baseLevel);
  tcu::ScopedLogSection::ScopedLogSection(&local_98,pTVar12,&local_b8,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&refParams.baseLevel);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_20c,TEXTURETYPE_CUBE_ARRAY);
  if ((0x1b < viewport.x) && (0x1b < viewport.y)) {
    glu::mapGLSampler(&local_248,0x812f,0x812f,this->m_minFilter,this->m_magFilter);
    tcu::Sampler::operator=
              ((Sampler *)(refParams.super_RenderParams.colorBias.m_data + 2),&local_248);
    refParams.sampler.borderColor.v.uData[2]._0_1_ = 1;
    local_250[0] = fmtInfo.lookupBias.m_data[2];
    local_250[1] = fmtInfo.lookupBias.m_data[3];
    local_20c._4_4_ =
         glu::TextureTestUtil::getSamplerType((TextureFormat)fmtInfo.lookupBias.m_data._8_8_);
    refParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
    refParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
    refParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
    refParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
    refParams.super_RenderParams.bias = fmtInfo.valueMax.m_data[2];
    refParams.super_RenderParams.ref = fmtInfo.valueMax.m_data[3];
    refParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
    refParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
    refParams.sampler.seamlessCubeMap = false;
    refParams.sampler._53_3_ = 0;
    pcVar1 = *(code **)(lVar8 + 0xb8);
    dVar4 = glu::TextureCubeArray::getGLTexture(pvVar9->texture);
    (*pcVar1)(0x9009,dVar4);
    (**(code **)(lVar8 + 0x1360))(0x9009,0x2801,this->m_minFilter);
    (**(code **)(lVar8 + 0x1360))(0x9009,0x2800,this->m_magFilter);
    (**(code **)(lVar8 + 0x1360))(0x9009,0x2802,this->m_wrapS);
    (**(code **)(lVar8 + 0x1360))(0x9009,0x2803,this->m_wrapT);
    (**(code **)(lVar8 + 0x1a00))((int)curCase,curCase._4_4_,viewport.x,viewport.y);
    pTVar12 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&face,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar13 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&face,(char (*) [14])"Coordinates: ");
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&pvVar9->bottomLeft);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [5])" -> ");
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&pvVar9->topRight);
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&face);
    for (result.m_pixels.m_cap._4_4_ = CUBEFACE_NEGATIVE_X; (int)result.m_pixels.m_cap._4_4_ < 6;
        result.m_pixels.m_cap._4_4_ = result.m_pixels.m_cap._4_4_ + CUBEFACE_POSITIVE_X) {
      tcu::Surface::Surface
                ((Surface *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,viewport.x,viewport.y);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_408);
      glu::TextureTestUtil::computeQuadTexCoordCubeArray
                ((vector<float,_std::allocator<float>_> *)local_408,result.m_pixels.m_cap._4_4_,
                 &pvVar9->bottomLeft,&pvVar9->topRight,&pvVar9->layerRange);
      tcu::TestLog::operator<<(&local_588,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar13 = tcu::MessageBuilder::operator<<(&local_588,(char (*) [6])0xf73f9d);
      local_590 = getFaceDesc(result.m_pixels.m_cap._4_4_);
      pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_590);
      tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_588);
      tcu::TestLog::operator<<(&local_710,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar13 = tcu::MessageBuilder::operator<<(&local_710,(char (*) [21])"Texture coordinates:");
      tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_710);
      logCubeArrayTexCoords(this_00,(vector<float,_std::allocator<float>_> *)local_408);
      pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_408,0);
      gls::TextureTestUtil::TextureRenderer::renderQuad
                (&this->m_renderer,0,pvVar14,(RenderParams *)local_20c);
      dVar4 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar4,"Draw",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFilteringTests.cpp"
                      ,0x173);
      y = curCase._4_4_;
      iVar3 = (int)curCase;
      tcu::Surface::getAccess
                ((PixelBufferAccess *)local_738,
                 (Surface *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      glu::readPixels(context,iVar3,y,(PixelBufferAccess *)local_738);
      dVar4 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar4,"Read pixels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFilteringTests.cpp"
                      ,0x176);
      local_c65 = false;
      if (this->m_minFilter == 0x2600) {
        local_c65 = this->m_magFilter == 0x2600;
      }
      iVar3 = (*context->_vptr_RenderContext[4])();
      pPVar15 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_00,iVar3));
      coordBits.m_data[2] = pPVar15->redBits;
      coordBits.m_data[3] = pPVar15->greenBits;
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(colorBits.m_data + 2),10);
      glu::TextureTestUtil::getBitsVec
                ((TextureTestUtil *)&local_798,(PixelFormat *)(coordBits.m_data + 2));
      tcu::operator-((tcu *)&local_788,&local_798,2 - (uint)local_c65);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&lodPrecision.derivateBits,0);
      tcu::max<int,4>((tcu *)local_778,&local_788,(Vector<int,_4> *)&lodPrecision.derivateBits);
      tcu::LodPrecision::LodPrecision
                ((LodPrecision *)(lookupPrecision.colorThreshold.m_data + 3),RULE_OPENGL);
      tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_7e0);
      lookupPrecision.colorMask.m_data[0] = true;
      lookupPrecision.colorMask.m_data[1] = false;
      lookupPrecision.colorMask.m_data[2] = false;
      lookupPrecision.colorMask.m_data[3] = false;
      lodPrecision.rule = 5;
      tcu::computeFixedPointThreshold((tcu *)&local_800,(IVec4 *)local_778);
      tcu::operator/(local_7f0,&local_800,(Vector<float,_4> *)&refParams.super_RenderParams.bias);
      lookupPrecision.uvwBits.m_data._4_8_ = local_7f0;
      lookupPrecision.colorThreshold.m_data[0] = afStack_7e8[0];
      lookupPrecision.colorThreshold.m_data[1] = afStack_7e8[1];
      tcu::Vector<int,_4>::toWidth<3>((Vector<int,_4> *)local_80c);
      lookupPrecision.coordBits.m_data[0] = local_80c._8_4_;
      local_7e0 = (undefined1  [8])local_80c._0_8_;
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)auStack_818,6);
      lookupPrecision.uvwBits.m_data[0] = local_810;
      lookupPrecision.coordBits.m_data[1] = _auStack_818;
      lookupPrecision.coordBits.m_data[2] = iStack_814;
      glu::TextureTestUtil::getCompareMask
                ((TextureTestUtil *)&local_81c,(PixelFormat *)(coordBits.m_data + 2));
      lookupPrecision.colorThreshold.m_data[2] = local_81c;
      pTVar2 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      tcu::Surface::getAccess
                ((PixelBufferAccess *)&local_848,
                 (Surface *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      pTVar10 = glu::TextureCubeArray::getRefTexture(pvVar9->texture);
      TVar17 = tcu::TextureCubeArray::operator_cast_to_TextureCubeArrayView(pTVar10);
      local_858.m_levels = TVar17.m_levels;
      local_858.m_numLevels = TVar17.m_numLevels;
      pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_408,0);
      local_81d = glu::TextureTestUtil::verifyTextureResult
                            (pTVar2,&local_848,&local_858,pvVar14,(ReferenceParams *)local_20c,
                             (LookupPrecision *)local_7e0,(IVec4 *)(colorBits.m_data + 2),
                             (LodPrecision *)(lookupPrecision.colorThreshold.m_data + 3),
                             (PixelFormat *)(coordBits.m_data + 2));
      if (!(bool)local_81d) {
        lodPrecision.rule = 4;
        tcu::Vector<int,_3>::Vector(&local_864,4);
        lookupPrecision.uvwBits.m_data[0] = local_864.m_data[2];
        lookupPrecision.coordBits.m_data[1] = local_864.m_data[0];
        lookupPrecision.coordBits.m_data[2] = local_864.m_data[1];
        pTVar12 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_9e8,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar13 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_9e8,
                             (char (*) [98])
                             "Warning: Verification against high precision requirements failed, trying with lower requirements."
                            );
        tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_9e8);
        pTVar2 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        tcu::Surface::getAccess
                  ((PixelBufferAccess *)&local_a18,
                   (Surface *)
                   &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        pTVar10 = glu::TextureCubeArray::getRefTexture(pvVar9->texture);
        TVar17 = tcu::TextureCubeArray::operator_cast_to_TextureCubeArrayView(pTVar10);
        local_a28.m_levels = TVar17.m_levels;
        local_a28.m_numLevels = TVar17.m_numLevels;
        pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_408,0);
        local_9e9 = glu::TextureTestUtil::verifyTextureResult
                              (pTVar2,&local_a18,&local_a28,pvVar14,(ReferenceParams *)local_20c,
                               (LookupPrecision *)local_7e0,(IVec4 *)(colorBits.m_data + 2),
                               (LodPrecision *)(lookupPrecision.colorThreshold.m_data + 3),
                               (PixelFormat *)(coordBits.m_data + 2));
        if ((bool)local_9e9) {
          qVar7 = tcu::TestContext::getTestResult
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          if (qVar7 == QP_TEST_RESULT_PASS) {
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_QUALITY_WARNING,"Low-quality filtering result");
          }
        }
        else {
          pTVar12 = tcu::TestContext::getLog
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_ba8,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar13 = tcu::MessageBuilder::operator<<
                              (&local_ba8,
                               (char (*) [82])
                               "ERROR: Verification against low precision requirements failed, failing test case."
                              );
          tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_ba8);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Image verification failed");
        }
      }
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_408);
      tcu::Surface::~Surface
                ((Surface *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    this->m_caseNdx = this->m_caseNdx + 1;
    iVar3 = this->m_caseNdx;
    sVar16 = std::
             vector<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
             ::size(&this->m_cases);
    tcu::ScopedLogSection::~ScopedLogSection(&local_98);
    return (uint)(iVar3 < (int)sVar16);
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_02,"Render target too small","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFilteringTests.cpp"
             ,0x150);
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

TextureCubeArrayFilteringCase::IterateResult TextureCubeArrayFilteringCase::iterate (void)
{
	TestLog&						log				= m_testCtx.getLog();
	const glu::RenderContext&		renderCtx		= m_context.getRenderContext();
	const glw::Functions&			gl				= renderCtx.getFunctions();
	const int						viewportSize	= 28;
	const deUint32					randomSeed		= deStringHash(getName()) ^ deInt32Hash(m_caseNdx) ^ m_testCtx.getCommandLine().getBaseSeed();
	const RandomViewport			viewport		(m_context.getRenderTarget(), viewportSize, viewportSize, randomSeed);
	const FilterCase&				curCase			= m_cases[m_caseNdx];
	const tcu::TextureFormat		texFmt			= curCase.texture->getRefTexture().getFormat();
	const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	const tcu::ScopedLogSection		section			(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	ReferenceParams					refParams		(TEXTURETYPE_CUBE_ARRAY);

	if (viewport.width < viewportSize || viewport.height < viewportSize)
		throw tcu::NotSupportedError("Render target too small", "", __FILE__, __LINE__);

	// Params for reference computation.
	refParams.sampler					= glu::mapGLSampler(GL_CLAMP_TO_EDGE, GL_CLAMP_TO_EDGE, m_minFilter, m_magFilter);
	refParams.sampler.seamlessCubeMap	= true;
	refParams.samplerType				= getSamplerType(texFmt);
	refParams.colorBias					= fmtInfo.lookupBias;
	refParams.colorScale				= fmtInfo.lookupScale;
	refParams.lodMode					= LODMODE_EXACT;

	gl.bindTexture	(GL_TEXTURE_CUBE_MAP_ARRAY, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_T,		m_wrapT);

	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	m_testCtx.getLog() << TestLog::Message << "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight << TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			result		(viewport.width, viewport.height);
		vector<float>			texCoord;

		computeQuadTexCoordCubeArray(texCoord, face, curCase.bottomLeft, curCase.topRight, curCase.layerRange);

		log << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		log << TestLog::Message << "Texture coordinates:" << TestLog::EndMessage;

		logCubeArrayTexCoords(log, texCoord);

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		glu::readPixels(renderCtx, viewport.x, viewport.y, result.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

		{
			const bool				isNearestOnly	= m_minFilter == GL_NEAREST && m_magFilter == GL_NEAREST;
			const tcu::PixelFormat	pixelFormat		= renderCtx.getRenderTarget().getPixelFormat();
			const tcu::IVec4		coordBits		= tcu::IVec4(10);
			const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
			tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
			tcu::LookupPrecision	lookupPrecision;

			lodPrecision.derivateBits		= 10;
			lodPrecision.lodBits			= 5;
			lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
			lookupPrecision.coordBits		= coordBits.toWidth<3>();
			lookupPrecision.uvwBits			= tcu::IVec3(6);
			lookupPrecision.colorMask		= getCompareMask(pixelFormat);

			const bool isHighQuality = verifyTextureResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
														   &texCoord[0], refParams, lookupPrecision, coordBits, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				// Evaluate against lower precision requirements.
				lodPrecision.lodBits	= 4;
				lookupPrecision.uvwBits	= tcu::IVec3(4);

				m_testCtx.getLog() << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

				const bool isOk = verifyTextureResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
													  &texCoord[0], refParams, lookupPrecision, coordBits, lodPrecision, pixelFormat);

				if (!isOk)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
				}
				else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality filtering result");
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}